

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-uname.c
# Opt level: O3

int run_test_uname(void)

{
  int iVar1;
  int extraout_EAX;
  uv_timer_t *puVar2;
  undefined8 uVar3;
  uv_timer_t *puVar4;
  code *pcVar5;
  uv_timer_t *puVar6;
  utsname buf;
  uv_utsname_t buffer;
  utsname local_586;
  char local_400 [256];
  char local_300 [256];
  char local_200 [256];
  char local_100 [256];
  
  iVar1 = uv_os_uname(0);
  if (iVar1 == -0x16) {
    iVar1 = uv_os_uname(local_400);
    if (iVar1 != 0) goto LAB_0017cefb;
    iVar1 = uname(&local_586);
    if (iVar1 == -1) goto LAB_0017cf00;
    iVar1 = strcmp(local_400,local_586.sysname);
    if (iVar1 != 0) goto LAB_0017cf05;
    iVar1 = strcmp(local_200,local_586.version);
    if (iVar1 != 0) goto LAB_0017cf0a;
    iVar1 = strcmp(local_300,local_586.release);
    if (iVar1 != 0) goto LAB_0017cf0f;
    iVar1 = strcmp(local_100,local_586.machine);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    run_test_uname_cold_1();
LAB_0017cefb:
    run_test_uname_cold_2();
LAB_0017cf00:
    run_test_uname_cold_7();
LAB_0017cf05:
    run_test_uname_cold_3();
LAB_0017cf0a:
    run_test_uname_cold_4();
LAB_0017cf0f:
    run_test_uname_cold_5();
  }
  run_test_uname_cold_6();
  puVar2 = (uv_timer_t *)uv_default_loop();
  puVar4 = &timer;
  puVar6 = puVar2;
  iVar1 = uv_timer_init();
  if (iVar1 == 0) {
    puVar6 = &timer;
    pcVar5 = timer_cb;
    iVar1 = uv_timer_start(&timer,timer_cb,1,0);
    if (iVar1 != 0) goto LAB_0017cfe8;
    if (seen_timer_handle != 0) goto LAB_0017cfed;
    pcVar5 = (code *)0x0;
    puVar6 = puVar2;
    iVar1 = uv_run();
    if (iVar1 != 0) goto LAB_0017cff2;
    if (seen_timer_handle != 1) goto LAB_0017cff7;
    seen_timer_handle = 0;
    pcVar5 = walk_cb;
    uv_walk(puVar2,walk_cb,magic_cookie);
    if (seen_timer_handle == 0) {
      uVar3 = uv_default_loop();
      uv_walk(uVar3,close_walk_cb,0);
      pcVar5 = (code *)0x0;
      uv_run(uVar3);
      puVar2 = (uv_timer_t *)uv_default_loop();
      iVar1 = uv_loop_close();
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_0017d001;
    }
  }
  else {
    run_test_walk_handles_cold_1();
    pcVar5 = (code *)puVar4;
LAB_0017cfe8:
    run_test_walk_handles_cold_2();
LAB_0017cfed:
    run_test_walk_handles_cold_3();
LAB_0017cff2:
    run_test_walk_handles_cold_4();
LAB_0017cff7:
    puVar2 = puVar6;
    run_test_walk_handles_cold_5();
  }
  run_test_walk_handles_cold_6();
LAB_0017d001:
  run_test_walk_handles_cold_7();
  if (puVar2 == &timer) {
    uv_walk(timer.loop,walk_cb,magic_cookie);
    iVar1 = uv_close(&timer,0);
    return iVar1;
  }
  timer_cb_cold_1();
  if (pcVar5 == (code *)magic_cookie) {
    if (puVar2 == &timer) {
      seen_timer_handle = seen_timer_handle + 1;
      return extraout_EAX;
    }
  }
  else {
    walk_cb_cold_1();
  }
  walk_cb_cold_2();
  iVar1 = uv_is_closing();
  if (iVar1 != 0) {
    return iVar1;
  }
  iVar1 = uv_close(puVar2,0);
  return iVar1;
}

Assistant:

TEST_IMPL(uname) {
#ifndef _WIN32
  struct utsname buf;
#endif
#ifdef _AIX
  char temp[256];
#endif
  uv_utsname_t buffer;
  int r;

  /* Verify that NULL is handled properly. */
  r = uv_os_uname(NULL);
  ASSERT(r == UV_EINVAL);

  /* Verify the happy path. */
  r = uv_os_uname(&buffer);
  ASSERT(r == 0);

#ifndef _WIN32
  ASSERT(uname(&buf) != -1);
  ASSERT(strcmp(buffer.sysname, buf.sysname) == 0);
  ASSERT(strcmp(buffer.version, buf.version) == 0);

# ifdef _AIX
  snprintf(temp, sizeof(temp), "%s.%s", buf.version, buf.release);
  ASSERT(strcmp(buffer.release, temp) == 0);
# else
  ASSERT(strcmp(buffer.release, buf.release) == 0);
# endif /* _AIX */

# if defined(_AIX) || defined(__PASE__)
  ASSERT(strcmp(buffer.machine, "ppc64") == 0);
# else
  ASSERT(strcmp(buffer.machine, buf.machine) == 0);
# endif /* defined(_AIX) || defined(__PASE__) */

#endif /* _WIN32 */

  return 0;
}